

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typevisitor.hh
# Opt level: O0

void __thiscall
Typelib::UnsupportedType::UnsupportedType(UnsupportedType *this,Type *type_,string *reason_)

{
  undefined1 local_a0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *reason__local;
  Type *type__local;
  UnsupportedType *this_local;
  
  local_20 = reason_;
  reason__local = (string *)type_;
  type__local = (Type *)this;
  Type::getName_abi_cxx11_((Type *)local_a0);
  std::operator+(local_a0 + 0x20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1fb88c);
  std::operator+(local_60,local_a0 + 0x20);
  std::operator+(local_40,local_60);
  TypeException::TypeException(&this->super_TypeException,local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(local_a0 + 0x20));
  std::__cxx11::string::~string((string *)local_a0);
  *(undefined ***)&this->super_TypeException = &PTR__UnsupportedType_00228a20;
  this->type = (Type *)reason__local;
  std::__cxx11::string::string((string *)&this->reason,(string *)local_20);
  return;
}

Assistant:

UnsupportedType(Type const& type_, std::string const& reason_)
            : TypeException("type " + type_.getName() + " not supported: " + reason_), type(type_), reason(reason_) {}